

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

int32_t stringIteratorGetIndex(UCharIterator *iter,UCharIteratorOrigin origin)

{
  UCharIteratorOrigin origin_local;
  UCharIterator *iter_local;
  
  switch(origin) {
  case UITER_START:
    iter_local._4_4_ = iter->start;
    break;
  case UITER_CURRENT:
    iter_local._4_4_ = iter->index;
    break;
  case UITER_LIMIT:
    iter_local._4_4_ = iter->limit;
    break;
  case UITER_ZERO:
    iter_local._4_4_ = 0;
    break;
  case UITER_LENGTH:
    iter_local._4_4_ = iter->length;
    break;
  default:
    iter_local._4_4_ = -1;
  }
  return iter_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
stringIteratorGetIndex(UCharIterator *iter, UCharIteratorOrigin origin) {
    switch(origin) {
    case UITER_ZERO:
        return 0;
    case UITER_START:
        return iter->start;
    case UITER_CURRENT:
        return iter->index;
    case UITER_LIMIT:
        return iter->limit;
    case UITER_LENGTH:
        return iter->length;
    default:
        /* not a valid origin */
        /* Should never get here! */
        return -1;
    }
}